

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::ConfidentialTxOut::GetWitnessHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTxOut *this)

{
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_28;
  
  ByteData256::ByteData256(__return_storage_ptr__);
  local_28.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::Serialize((ByteData *)&local_40,&this->surjection_proof_);
  HashUtil::Sha256D((ByteData256 *)&_Stack_58,(ByteData *)&local_40);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&local_28,(ByteData256 *)&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ByteData::Serialize((ByteData *)&local_40,&this->range_proof_);
  HashUtil::Sha256D((ByteData256 *)&_Stack_58,(ByteData *)&local_40);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&local_28,(ByteData256 *)&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  CryptoUtil::ComputeFastMerkleRoot
            ((ByteData256 *)&_Stack_58,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_28);
  ByteData256::operator=(__return_storage_ptr__,(ByteData256 *)&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_28)
  ;
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTxOut::GetWitnessHash() const {
  ByteData256 result;
  std::vector<ByteData256> leaves;
  leaves.push_back(HashUtil::Sha256D(surjection_proof_.Serialize()));
  leaves.push_back(HashUtil::Sha256D(range_proof_.Serialize()));
  result = CryptoUtil::ComputeFastMerkleRoot(leaves);
  return result;
}